

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O1

void __thiscall
cmCTestTestHandler::ProcessDirectory
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *passed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *failed)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  size_t sVar4;
  size_t __n;
  pointer pcVar5;
  pointer pcVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  cmCTestMultiProcessHandler *pcVar10;
  ostream *poVar11;
  time_t tVar12;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_00;
  mapped_type *ppcVar13;
  iterator i;
  pointer pbVar14;
  mapped_type pcVar15;
  pointer pcVar16;
  pointer this_01;
  double dVar17;
  TestSet depends;
  TestMap tests;
  PropertiesMap properties;
  undefined1 local_e0 [32];
  _Base_ptr local_c0;
  size_t local_b8;
  cmCTestMultiProcessHandler *local_b0;
  undefined1 local_a8 [32];
  _Base_ptr local_88;
  size_t local_80;
  double local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_68;
  _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
  local_60;
  
  local_70 = passed;
  local_68 = failed;
  ComputeTestList(this);
  cmCTest::CurrentTime_abi_cxx11_((string *)local_a8,(this->super_cmCTestGenericHandler).CTest);
  std::__cxx11::string::operator=((string *)&this->StartTest,(string *)local_a8);
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  dVar17 = cmsys::SystemTools::GetTime();
  this->StartTestTime = (uint)(long)dVar17;
  local_78 = cmsys::SystemTools::GetTime();
  if (((this->super_cmCTestGenericHandler).CTest)->BatchJobs == true) {
    pcVar10 = (cmCTestMultiProcessHandler *)operator_new(0x200);
    cmCTestMultiProcessHandler::cmCTestMultiProcessHandler(pcVar10);
    pcVar10->_vptr_cmCTestMultiProcessHandler = (_func_int **)&PTR__cmCTestBatchTestHandler_006bb3b0
    ;
    pcVar10[1]._vptr_cmCTestMultiProcessHandler =
         (_func_int **)
         &pcVar10[1].Tests.
          super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
          ._M_t._M_impl.super__Rb_tree_header;
    *(undefined8 *)
     &pcVar10[1].Tests.
      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ._M_t._M_impl = 0;
    *(undefined1 *)
     &pcVar10[1].Tests.
      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  }
  else {
    pcVar10 = (cmCTestMultiProcessHandler *)operator_new(0x1e0);
    cmCTestMultiProcessHandler::cmCTestMultiProcessHandler(pcVar10);
  }
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  pcVar10->CTest = pcVar1;
  cmCTestMultiProcessHandler::SetParallelLevel(pcVar10,(long)pcVar1->ParallelLevel);
  pcVar10->TestHandler = this;
  pcVar10->Quiet = (this->super_cmCTestGenericHandler).Quiet;
  poVar11 = this->LogFile;
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"Start testing: ",0xf);
  cmCTest::CurrentTime_abi_cxx11_((string *)local_a8,(this->super_cmCTestGenericHandler).CTest);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,(char *)local_a8._0_8_,CONCAT44(local_a8._12_4_,local_a8._8_4_));
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  poVar11 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,"----------------------------------------------------------",0x3a);
  std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
  std::ostream::put((char)poVar11);
  std::ostream::flush();
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  local_a8._24_8_ = local_a8 + 8;
  local_a8._8_4_ = _S_red;
  local_a8._16_8_ = 0;
  local_80 = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  pcVar2 = (pcVar1->ScheduleType)._M_dataplus._M_p;
  local_e0._0_8_ = local_e0 + 0x10;
  local_88 = (_Base_ptr)local_a8._24_8_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_e0,pcVar2,pcVar2 + (pcVar1->ScheduleType)._M_string_length);
  iVar8 = std::__cxx11::string::compare(local_e0);
  if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
    operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
  }
  local_b0 = pcVar10;
  if (iVar8 == 0) {
    tVar12 = time((time_t *)0x0);
    srand((uint)tVar12);
  }
  pcVar15 = (this->TestList).
            super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    pcVar10 = local_b0;
    if (pcVar15 ==
        (this->TestList).
        super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      cmCTestMultiProcessHandler::SetTests(local_b0,(TestMap *)local_a8,(PropertiesMap *)&local_60);
      pcVar10->Passed = local_70;
      pcVar10->Failed = local_68;
      pcVar5 = (this->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pcVar6 = (this->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      this_01 = pcVar5;
      if (pcVar6 != pcVar5) {
        do {
          cmCTestTestResult::~cmCTestTestResult(this_01);
          this_01 = this_01 + 1;
        } while (this_01 != pcVar6);
        (this->TestResults).
        super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
        ._M_impl.super__Vector_impl_data._M_finish = pcVar5;
      }
      pcVar10 = local_b0;
      local_b0->TestResults = &this->TestResults;
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      if (pcVar1->PrintLabels == true) {
        cmCTestMultiProcessHandler::PrintLabels(local_b0);
      }
      else {
        bVar7 = cmCTest::GetShowOnly(pcVar1);
        if (bVar7) {
          cmCTestMultiProcessHandler::PrintTestList(pcVar10);
        }
        else {
          (*pcVar10->_vptr_cmCTestMultiProcessHandler[2])(pcVar10);
        }
      }
      (*pcVar10->_vptr_cmCTestMultiProcessHandler[1])(pcVar10);
      cmCTest::CurrentTime_abi_cxx11_((string *)local_e0,(this->super_cmCTestGenericHandler).CTest);
      std::__cxx11::string::operator=((string *)&this->EndTest,(string *)local_e0);
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
      }
      dVar17 = cmsys::SystemTools::GetTime();
      this->EndTestTime = (uint)(long)dVar17;
      dVar17 = cmsys::SystemTools::GetTime();
      this->ElapsedTestingTime = dVar17 - local_78;
      poVar11 = this->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"End testing: ",0xd);
      cmCTest::CurrentTime_abi_cxx11_((string *)local_e0,(this->super_cmCTestGenericHandler).CTest);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,(char *)local_e0._0_8_,CONCAT44(local_e0._12_4_,local_e0._8_4_));
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
        operator_delete((void *)local_e0._0_8_,(ulong)(local_e0._16_8_ + 1));
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>,_std::_Select1st<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>,_std::_Select1st<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                   *)local_a8);
      return;
    }
    local_e0._8_4_ = _S_red;
    local_e0._16_8_ = (_Base_ptr)0x0;
    local_e0._24_8_ = local_e0 + 8;
    local_b8 = 0;
    local_c0 = (_Base_ptr)local_e0._24_8_;
    if (iVar8 == 0) {
      iVar9 = rand();
      pcVar15->Cost = (float)iVar9;
    }
    if ((pcVar15->Timeout == 0.0) && (!NAN(pcVar15->Timeout))) {
      dVar17 = ((this->super_cmCTestGenericHandler).CTest)->GlobalTimeout;
      if ((dVar17 != 0.0) || (NAN(dVar17))) {
        pcVar15->Timeout = dVar17;
      }
    }
    pbVar14 = (pcVar15->Depends).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (pbVar14 !=
        (pcVar15->Depends).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      for (; pbVar14 !=
             (pcVar15->Depends).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; pbVar14 = pbVar14 + 1) {
        pcVar16 = (this->TestList).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pcVar3 = (this->TestList).
                 super__Vector_base<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pcVar16 != pcVar3) {
          sVar4 = pbVar14->_M_string_length;
          do {
            __n = (pcVar16->Name)._M_string_length;
            if ((__n == sVar4) &&
               ((__n == 0 ||
                (iVar9 = bcmp((pcVar16->Name)._M_dataplus._M_p,(pbVar14->_M_dataplus)._M_p,__n),
                iVar9 == 0)))) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )local_e0,&pcVar16->Index);
              break;
            }
            pcVar16 = pcVar16 + 1;
          } while (pcVar16 != pcVar3);
        }
      }
    }
    this_00 = (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
              std::
              map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
              ::operator[]((map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                            *)local_a8,&pcVar15->Index);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
              (this_00,(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        *)local_e0);
    ppcVar13 = std::
               map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
               ::operator[]((map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             *)&local_60,&pcVar15->Index);
    *ppcVar13 = pcVar15;
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_e0);
    pcVar15 = pcVar15 + 1;
  } while( true );
}

Assistant:

void cmCTestTestHandler::ProcessDirectory(std::vector<std::string> &passed,
                                         std::vector<std::string> &failed)
{
  this->ComputeTestList();
  this->StartTest = this->CTest->CurrentTime();
  this->StartTestTime = static_cast<unsigned int>(cmSystemTools::GetTime());
  double elapsed_time_start = cmSystemTools::GetTime();

  cmCTestMultiProcessHandler* parallel = this->CTest->GetBatchJobs() ?
    new cmCTestBatchTestHandler : new cmCTestMultiProcessHandler;
  parallel->SetCTest(this->CTest);
  parallel->SetParallelLevel(this->CTest->GetParallelLevel());
  parallel->SetTestHandler(this);
  parallel->SetQuiet(this->Quiet);

  *this->LogFile << "Start testing: "
    << this->CTest->CurrentTime() << std::endl
    << "----------------------------------------------------------"
    << std::endl;

  cmCTestMultiProcessHandler::TestMap tests;
  cmCTestMultiProcessHandler::PropertiesMap properties;

  bool randomSchedule = this->CTest->GetScheduleType() == "Random";
  if(randomSchedule)
    {
    srand((unsigned)time(0));
    }

  for (ListOfTests::iterator it = this->TestList.begin();
       it != this->TestList.end(); ++it)
    {
    cmCTestTestProperties& p = *it;
    cmCTestMultiProcessHandler::TestSet depends;

    if(randomSchedule)
      {
      p.Cost = static_cast<float>(rand());
      }

    if(p.Timeout == 0 && this->CTest->GetGlobalTimeout() != 0)
      {
      p.Timeout = this->CTest->GetGlobalTimeout();
      }

    if(!p.Depends.empty())
      {
      for(std::vector<std::string>::iterator i = p.Depends.begin();
          i != p.Depends.end(); ++i)
        {
        for(ListOfTests::iterator it2 = this->TestList.begin();
            it2 != this->TestList.end(); ++it2)
          {
          if(it2->Name == *i)
            {
            depends.insert(it2->Index);
            break; // break out of test loop as name can only match 1
            }
          }
        }
      }
    tests[it->Index] = depends;
    properties[it->Index] = &*it;
    }
  parallel->SetTests(tests, properties);
  parallel->SetPassFailVectors(&passed, &failed);
  this->TestResults.clear();
  parallel->SetTestResults(&this->TestResults);

  if(this->CTest->ShouldPrintLabels())
    {
    parallel->PrintLabels();
    }
  else if(this->CTest->GetShowOnly())
    {
    parallel->PrintTestList();
    }
  else
    {
    parallel->RunTests();
    }
  delete parallel;
  this->EndTest = this->CTest->CurrentTime();
  this->EndTestTime = static_cast<unsigned int>(cmSystemTools::GetTime());
  this->ElapsedTestingTime = cmSystemTools::GetTime() - elapsed_time_start;
  *this->LogFile << "End testing: "
     << this->CTest->CurrentTime() << std::endl;
}